

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

string * __thiscall
args::ValueFlagList<int,args::detail::vector,args::ValueReader>::Name_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  void *local_18;
  ValueFlagList<int,_args::detail::vector,_args::ValueReader> *this_local;
  
  local_18 = this;
  this_local = (ValueFlagList<int,_args::detail::vector,_args::ValueReader> *)__return_storage_ptr__
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"...",&local_39);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)this + 0x30),&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Name() const override
            {
                return name + std::string("...");
            }